

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

void boost::filesystem::detail::create_symlink(path *to,path *from,error_code *ec)

{
  int iVar1;
  value_type *__from;
  value_type *__to;
  int *piVar2;
  err_t local_2c;
  error_code *ec_local;
  path *from_local;
  path *to_local;
  
  __from = filesystem::path::c_str(to);
  __to = filesystem::path::c_str(from);
  iVar1 = symlink(__from,__to);
  if (iVar1 == 0) {
    local_2c = 0;
  }
  else {
    piVar2 = __errno_location();
    local_2c = *piVar2;
  }
  anon_unknown.dwarf_522f::error(local_2c,to,from,ec,"boost::filesystem::create_symlink");
  return;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void create_symlink(const path& to, const path& from, error_code* ec)
  {
#   if defined(BOOST_WINDOWS_API) && _WIN32_WINNT < 0x0600  // SDK earlier than Vista and Server 2008
    error(BOOST_ERROR_NOT_SUPPORTED, to, from, ec,
      "boost::filesystem::create_directory_symlink");
#   else

#     if defined(BOOST_WINDOWS_API) && _WIN32_WINNT >= 0x0600
        // see if actually supported by Windows runtime dll
        if (error(!create_symbolic_link_api ? BOOST_ERROR_NOT_SUPPORTED : 0, to, from, ec,
            "boost::filesystem::create_symlink"))
          return;
#     endif

    error(!BOOST_CREATE_SYMBOLIC_LINK(from.c_str(), to.c_str(), 0) ? BOOST_ERRNO : 0,
      to, from, ec, "boost::filesystem::create_symlink");
#   endif
  }